

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O0

IAnimatedMesh * __thiscall
irr::scene::CXMeshFileLoader::createMesh(CXMeshFileLoader *this,IReadFile *file)

{
  bool bVar1;
  u32 uVar2;
  array<irr::scene::CXMeshFileLoader::SXMesh_*> *this_00;
  SXMesh **ppSVar3;
  long in_RSI;
  long in_RDI;
  u32 i;
  IReadFile *in_stack_000002a0;
  CXMeshFileLoader *in_stack_000002a8;
  SXMesh *in_stack_ffffffffffffffb8;
  u32 index;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  undefined4 local_1c;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = (IAnimatedMesh *)0x0;
  }
  else {
    this_00 = (array<irr::scene::CXMeshFileLoader::SXMesh_*> *)operator_new(0xd8);
    CSkinnedMesh::CSkinnedMesh
              ((CSkinnedMesh *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *(array<irr::scene::CXMeshFileLoader::SXMesh_*> **)(in_RDI + 8) = this_00;
    bVar1 = load(in_stack_000002a8,in_stack_000002a0);
    if (bVar1) {
      (**(code **)(**(long **)(in_RDI + 8) + 0xe8))();
    }
    else {
      IReferenceCounted::drop((IReferenceCounted *)in_stack_ffffffffffffffb8);
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(undefined4 *)(in_RDI + 0x80) = 0;
    *(undefined4 *)(in_RDI + 0x84) = 0;
    *(undefined1 *)(in_RDI + 0x88) = 0;
    *(undefined4 *)(in_RDI + 0x28) = 0;
    *(undefined1 *)(in_RDI + 0x89) = 0;
    *(undefined8 *)(in_RDI + 0x18) = 0;
    *(undefined8 *)(in_RDI + 0x20) = 0;
    *(undefined8 *)(in_RDI + 0x58) = 0;
    if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 0x10));
    }
    *(undefined8 *)(in_RDI + 0x10) = 0;
    local_1c = 0;
    while( true ) {
      index = (u32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      uVar4 = local_1c;
      uVar2 = core::array<irr::scene::CXMeshFileLoader::SXMesh_*>::size
                        ((array<irr::scene::CXMeshFileLoader::SXMesh_*> *)0x2e2173);
      if (uVar2 <= uVar4) break;
      ppSVar3 = core::array<irr::scene::CXMeshFileLoader::SXMesh_*>::operator[]
                          ((array<irr::scene::CXMeshFileLoader::SXMesh_*> *)
                           CONCAT44(uVar4,in_stack_ffffffffffffffc0),index);
      in_stack_ffffffffffffffb8 = *ppSVar3;
      if (in_stack_ffffffffffffffb8 != (SXMesh *)0x0) {
        SXMesh::~SXMesh((SXMesh *)CONCAT44(uVar4,in_stack_ffffffffffffffc0));
        operator_delete(in_stack_ffffffffffffffb8,0x158);
      }
      local_1c = local_1c + 1;
    }
    core::array<irr::scene::CXMeshFileLoader::SXMesh_*>::clear(this_00);
    local_8 = *(IAnimatedMesh **)(in_RDI + 8);
  }
  return local_8;
}

Assistant:

IAnimatedMesh *CXMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

#ifdef _XREADER_DEBUG
	u32 time = os::Timer::getRealTime();
#endif

	AnimatedMesh = new CSkinnedMesh();

	if (load(file)) {
		AnimatedMesh->finalize();
	} else {
		AnimatedMesh->drop();
		AnimatedMesh = 0;
	}
#ifdef _XREADER_DEBUG
	time = os::Timer::getRealTime() - time;
	core::stringc tmpString = "Time to load ";
	tmpString += BinaryFormat ? "binary" : "ascii";
	tmpString += " X file: ";
	tmpString += time;
	tmpString += "ms";
	os::Printer::log(tmpString.c_str());
#endif
	// Clear up

	MajorVersion = 0;
	MinorVersion = 0;
	BinaryFormat = 0;
	BinaryNumCount = 0;
	FloatSize = 0;
	P = 0;
	End = 0;
	CurFrame = 0;

	delete[] Buffer;
	Buffer = 0;

	for (u32 i = 0; i < Meshes.size(); ++i)
		delete Meshes[i];
	Meshes.clear();

	return AnimatedMesh;
}